

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O0

void __thiscall QHttpMultiPartIODevice::~QHttpMultiPartIODevice(QHttpMultiPartIODevice *this)

{
  QHttpMultiPartIODevice *in_RDI;
  
  ~QHttpMultiPartIODevice(in_RDI);
  operator_delete(in_RDI,0x40);
  return;
}

Assistant:

QHttpMultiPartIODevice::~QHttpMultiPartIODevice()
    = default;